

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TracerouteRunner.cpp
# Opt level: O1

void __thiscall TracerouteRunner::fetch_results(TracerouteRunner *this)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  runtime_error *this_00;
  string cmd;
  array<char,_1024UL> buffer;
  char *local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  char local_428 [1024];
  
  memset(local_428,0,0x400);
  std::operator+(&local_448,"traceroute ",&this->network_address);
  __stream = popen(local_448._M_dataplus._M_p,"r");
  if (__stream == (FILE *)0x0) {
LAB_00108b5f:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"popen() failed!");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar2 = fgets(local_428,0x400,__stream);
  if (pcVar2 != (char *)0x0) {
    do {
      iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex_results);
      if (iVar1 != 0) {
        std::__throw_system_error(iVar1);
        goto LAB_00108b5f;
      }
      local_450 = local_428;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::emplace_back<char*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,
                 &local_450);
      pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_results);
      pcVar2 = fgets(local_428,0x400,__stream);
    } while (pcVar2 != (char *)0x0);
  }
  this->read_complete = true;
  pclose(__stream);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void TracerouteRunner::fetch_results() {
	std::array<char, 1024> buffer {};
	const std::string cmd = "traceroute " + this->network_address;

	std::unique_ptr<FILE, decltype(&pclose)> pipe(popen(cmd.c_str(), "r"), pclose);
	if (!pipe) {
		throw std::runtime_error("popen() failed!");
	}

	while (fgets(buffer.data(), buffer.size(), pipe.get()) != nullptr) {
		this->mutex_results.lock();
		this->results.emplace_back(buffer.data());
		this->mutex_results.unlock();
	}

	this->read_complete = true;
}